

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::
statement_inner<std::__cxx11::string,char_const(&)[42],std::__cxx11::string,char_const(&)[28],std::__cxx11::string,char_const(&)[14],std::__cxx11::string,char_const(&)[51],std::__cxx11::string,char_const(&)[27],std::__cxx11::string,char_const(&)[13],std::__cxx11::string,char_const(&)[24]>
          (CompilerGLSL *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
          char (*ts) [42],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,
          char (*ts_2) [28],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3,
          char (*ts_4) [14],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_5,
          char (*ts_6) [51],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_7,
          char (*ts_8) [27],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_9,
          char (*ts_10) [13],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_11,
          char (*ts_12) [24])

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_3;
  char (*ts_local_2) [28];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_1;
  char (*ts_local) [42];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  CompilerGLSL *this_local;
  
  StringStream<4096UL,_4096UL>::operator<<(&this->buffer,t);
  this->statement_count = this->statement_count + 1;
  statement_inner<char_const(&)[42],std::__cxx11::string,char_const(&)[28],std::__cxx11::string,char_const(&)[14],std::__cxx11::string,char_const(&)[51],std::__cxx11::string,char_const(&)[27],std::__cxx11::string,char_const(&)[13],std::__cxx11::string,char_const(&)[24]>
            (this,ts,ts_1,ts_2,ts_3,ts_4,ts_5,ts_6,ts_7,ts_8,ts_9,ts_10,ts_11,ts_12);
  return;
}

Assistant:

inline void statement_inner(T &&t, Ts &&... ts)
	{
		buffer << std::forward<T>(t);
		statement_count++;
		statement_inner(std::forward<Ts>(ts)...);
	}